

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathQuat.h
# Opt level: O0

void __thiscall
Imath_3_2::Quat<double>::setRotationInternal
          (Quat<double> *this,Vec3<double> *f0,Vec3<double> *t0,Quat<double> *q)

{
  double *in_RCX;
  double dVar1;
  Vec3<double> h0;
  Vec3<double> *in_stack_ffffffffffffff98;
  Vec3<double> *in_stack_ffffffffffffffa0;
  Vec3<double> *in_stack_ffffffffffffffa8;
  Vec3<double> *in_stack_ffffffffffffffb8;
  
  Vec3<double>::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Vec3<double>::normalized(in_stack_ffffffffffffffb8);
  dVar1 = Vec3<double>::operator^(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *in_RCX = dVar1;
  Vec3<double>::operator%(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  Vec3<double>::operator=((Vec3<double> *)(in_RCX + 1),(Vec3<double> *)&stack0xffffffffffffff98);
  return;
}

Assistant:

IMATH_HOSTDEVICE inline void
Quat<T>::setRotationInternal (const Vec3<T>& f0, const Vec3<T>& t0, Quat<T>& q)
    IMATH_NOEXCEPT
{
    //
    // The following is equivalent to setAxisAngle(n,2*phi),
    // where the rotation axis, n, is orthogonal to the f0 and
    // t0 vectors, and 2*phi is the angle between f0 and t0.
    //
    // This function is called by setRotation(), above; it assumes
    // that f0 and t0 are normalized and that the angle between
    // them is not much greater than pi/2.  This function becomes
    // numerically inaccurate if f0 and t0 point into nearly
    // opposite directions.
    //

    //
    // Find a normalized vector, h0, that is halfway between f0 and t0.
    // The angle between f0 and h0 is phi.
    //

    Vec3<T> h0 = (f0 + t0).normalized ();

    //
    // Store the rotation axis and rotation angle.
    //

    q.r = f0 ^ h0; //  f0 ^ h0 == cos (phi)
    q.v = f0 % h0; // (f0 % h0).length() == sin (phi)
}